

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_get_ddos_config_options.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_55b76::Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::
Json2Array(Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *this,
          Value *value,
          vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
          *vec)

{
  bool bVar1;
  ArrayIndex AVar2;
  Int IVar3;
  Value *pVVar4;
  Value *this_00;
  int i;
  uint index;
  YundunGetDdosConfigOptionsRequestThresholdOptionType val;
  value_type local_40;
  
  bVar1 = Json::Value::isArray((Value *)this);
  if (bVar1) {
    index = 0;
    while( true ) {
      AVar2 = Json::Value::size((Value *)this);
      if (AVar2 <= index) break;
      pVVar4 = Json::Value::operator[]((Value *)this,index);
      bVar1 = Json::Value::isMember(pVVar4,"Bps");
      if (bVar1) {
        this_00 = Json::Value::operator[](pVVar4,"Bps");
        IVar3 = Json::Value::asInt(this_00);
        local_40.bps = (long)IVar3;
      }
      bVar1 = Json::Value::isMember(pVVar4,"Pps");
      if (bVar1) {
        pVVar4 = Json::Value::operator[](pVVar4,"Pps");
        IVar3 = Json::Value::asInt(pVVar4);
        local_40.pps = (long)IVar3;
      }
      std::
      vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
      ::push_back((vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
                   *)value,&local_40);
      index = index + 1;
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }